

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

LiteralNumber * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::LiteralNumber,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,char_const(&)[4]>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,char (*args_2) [4])

{
  LiteralNumber *pLVar1;
  LocationRange *in_RCX;
  list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *in_RDX;
  string *in_RSI;
  LiteralNumber *r;
  LiteralNumber *this_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  LiteralNumber *local_28;
  LocationRange *local_20;
  list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *local_18;
  string *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pLVar1 = (LiteralNumber *)operator_new(0xa8);
  uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffa0);
  this_00 = (LiteralNumber *)&stack0xffffffffffffffb7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffffa4,uVar2));
  LiteralNumber::LiteralNumber(this_00,local_20,(Fodder *)local_18,local_10);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  local_28 = pLVar1;
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            (local_18,(value_type *)local_10);
  return local_28;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }